

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_layout.cc
# Opt level: O2

void upb::generator::AddMessages
               (MessageDefPtr message,
               vector<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_> *messages)

{
  int iVar1;
  MessageDefPtr message_00;
  int i;
  int i_00;
  value_type local_18;
  
  local_18.ptr_ = message.ptr_;
  std::vector<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_>::push_back
            (messages,&local_18);
  i_00 = 0;
  while( true ) {
    iVar1 = upb_MessageDef_NestedMessageCount(local_18.ptr_);
    if (iVar1 <= i_00) break;
    message_00.ptr_ = upb_MessageDef_NestedMessage(local_18.ptr_,i_00);
    AddMessages(message_00,messages);
    i_00 = i_00 + 1;
  }
  return;
}

Assistant:

void AddMessages(upb::MessageDefPtr message,
                 std::vector<upb::MessageDefPtr>* messages) {
  messages->push_back(message);
  for (int i = 0; i < message.nested_message_count(); i++) {
    AddMessages(message.nested_message(i), messages);
  }
}